

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::CampaignReader::InitTransports(CampaignReader *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  DataType DVar4;
  DataType DVar5;
  DataType DVar6;
  ArrayOrdering AVar7;
  ArrayOrdering AVar8;
  ArrayOrdering AVar9;
  char *pcVar10;
  ulong uVar11;
  undefined8 uVar12;
  ostream *poVar13;
  size_type sVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar15;
  reference pvVar16;
  IO *pIVar17;
  reference pvVar18;
  reference pvVar19;
  Engine *pEVar20;
  size_type sVar21;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pAVar22;
  Attribute<char> *pAVar23;
  Attribute<signed_char> *pAVar24;
  Attribute<short> *pAVar25;
  Attribute<int> *pAVar26;
  Attribute<unsigned_char> *pAVar27;
  Attribute<unsigned_short> *pAVar28;
  Attribute<unsigned_int> *pAVar29;
  Attribute<float> *pAVar30;
  Attribute<long_double> *pAVar31;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar32;
  Attribute<std::complex<double>_> v_29;
  Attribute<std::complex<double>_> *ai_14;
  Attribute<std::complex<float>_> v_28;
  Attribute<std::complex<float>_> *ai_13;
  Attribute<long_double> v_27;
  Attribute<long_double> *ai_12;
  Attribute<double> v_26;
  Attribute<double> *ai_11;
  Attribute<float> v_25;
  Attribute<float> *ai_10;
  Attribute<unsigned_long> v_24;
  Attribute<unsigned_long> *ai_9;
  Attribute<unsigned_int> v_23;
  Attribute<unsigned_int> *ai_8;
  Attribute<unsigned_short> v_22;
  Attribute<unsigned_short> *ai_7;
  Attribute<unsigned_char> v_21;
  Attribute<unsigned_char> *ai_6;
  Attribute<long> v_20;
  Attribute<long> *ai_5;
  Attribute<int> v_19;
  Attribute<int> *ai_4;
  Attribute<short> v_18;
  Attribute<short> *ai_3;
  Attribute<signed_char> v_17;
  Attribute<signed_char> *ai_2;
  Attribute<char> v_16;
  Attribute<char> *ai_1;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v_15;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *ai;
  DataType type_1;
  string newname_1;
  string fname_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> aname;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *ar;
  iterator __end3_2;
  iterator __begin3_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range3_2;
  Variable<std::complex<double>_> v_14;
  Variable<std::complex<double>_> *vi_14;
  Variable<std::complex<float>_> v_13;
  Variable<std::complex<float>_> *vi_13;
  Variable<long_double> v_12;
  Variable<long_double> *vi_12;
  Variable<double> v_11;
  Variable<double> *vi_11;
  Variable<float> v_10;
  Variable<float> *vi_10;
  Variable<unsigned_long> v_9;
  Variable<unsigned_long> *vi_9;
  Variable<unsigned_int> v_8;
  Variable<unsigned_int> *vi_8;
  Variable<unsigned_short> v_7;
  Variable<unsigned_short> *vi_7;
  Variable<unsigned_char> v_6;
  Variable<unsigned_char> *vi_6;
  Variable<long> v_5;
  Variable<long> *vi_5;
  Variable<int> v_4;
  Variable<int> *vi_4;
  Variable<short> v_3;
  Variable<short> *vi_3;
  Variable<signed_char> v_2;
  Variable<signed_char> *vi_2;
  Variable<char> v_1;
  Variable<char> *vi_1;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *vi;
  DataType type;
  string newname;
  string fname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> vname;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *vr;
  iterator __end3_1;
  iterator __begin3_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *__range3_1;
  VarInternalInfo internalInfo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  amap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  vmap;
  Engine *e;
  ofstream f;
  CampaignBPFile *bpf_1;
  iterator __end5;
  iterator __begin5;
  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  *__range5;
  string keyhex;
  string remoteURL;
  string remotePath;
  string es;
  Params p;
  string objPath;
  string endpointURL;
  HostConfig *ho;
  const_iterator it_2;
  bool done;
  string localPath;
  IO *io;
  CampaignBPDataset *ds_1;
  pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset> *it_1;
  iterator __end2;
  iterator __begin2;
  map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
  *__range2;
  int i;
  unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> connectionManager;
  CampaignBPFile *bpf;
  iterator __end4;
  iterator __begin4;
  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
  *__range4;
  CampaignBPDataset *ds;
  pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset> *it;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
  *__range3;
  CampaignKey *k;
  size_t keyidx;
  size_t diridx;
  CampaignHost *h;
  size_t hostidx;
  string dbmsg;
  int rc;
  string path2;
  string path;
  string *in_stack_ffffffffffffb958;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffb960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb968;
  Attribute<std::complex<double>_> *in_stack_ffffffffffffb970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb978;
  IO *in_stack_ffffffffffffb980;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb988;
  undefined4 in_stack_ffffffffffffb990;
  ArrayOrdering in_stack_ffffffffffffb994;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb998;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffb9a0;
  Attribute<std::complex<float>_> *in_stack_ffffffffffffb9a8;
  string *in_stack_ffffffffffffb9b0;
  allocator *paVar33;
  string *in_stack_ffffffffffffb9b8;
  string *in_stack_ffffffffffffb9c0;
  undefined4 in_stack_ffffffffffffb9c8;
  ArrayOrdering in_stack_ffffffffffffb9cc;
  IO *in_stack_ffffffffffffb9f0;
  string *in_stack_ffffffffffffb9f8;
  undefined4 in_stack_ffffffffffffba00;
  ArrayOrdering in_stack_ffffffffffffba04;
  IO *in_stack_ffffffffffffba08;
  string *in_stack_ffffffffffffba10;
  IO *in_stack_ffffffffffffba18;
  IO *in_stack_ffffffffffffba28;
  string *in_stack_ffffffffffffba30;
  undefined4 in_stack_ffffffffffffba38;
  ArrayOrdering in_stack_ffffffffffffba3c;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffba40;
  CampaignReader *in_stack_ffffffffffffba48;
  ArrayOrdering in_stack_ffffffffffffba74;
  string *in_stack_ffffffffffffba78;
  string *in_stack_ffffffffffffba80;
  IO *in_stack_ffffffffffffba88;
  string *in_stack_ffffffffffffba90;
  IO *in_stack_ffffffffffffba98;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffbaa0;
  undefined4 in_stack_ffffffffffffbaa8;
  ArrayOrdering in_stack_ffffffffffffbaac;
  string *in_stack_ffffffffffffbb60;
  Attribute<long> *in_stack_ffffffffffffbb68;
  IO *in_stack_ffffffffffffbb70;
  ArrayOrdering in_stack_ffffffffffffbb8c;
  string *in_stack_ffffffffffffbb90;
  ADIOS *in_stack_ffffffffffffbb98;
  ostream *in_stack_ffffffffffffbd90;
  IO *in_stack_ffffffffffffbd98;
  string *in_stack_ffffffffffffbee8;
  undefined7 in_stack_ffffffffffffbef0;
  undefined1 in_stack_ffffffffffffbef7;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffbef8;
  undefined7 in_stack_ffffffffffffbf00;
  undefined1 in_stack_ffffffffffffbf07;
  CampaignData *in_stack_ffffffffffffbfc8;
  sqlite3 *in_stack_ffffffffffffbfd0;
  string *in_stack_ffffffffffffc058;
  undefined4 in_stack_ffffffffffffc064;
  undefined1 local_3f01 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3ed9;
  Attribute<std::complex<double>_> *local_3eb8;
  allocator local_3e49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e48;
  string local_3e21;
  Attribute<std::complex<float>_> *local_3e00;
  size_t in_stack_ffffffffffffc218;
  char *in_stack_ffffffffffffc220;
  Comm *in_stack_ffffffffffffc228;
  Mode in_stack_ffffffffffffc234;
  string *in_stack_ffffffffffffc238;
  IO *in_stack_ffffffffffffc240;
  allocator local_3d81;
  string local_3d80 [39];
  undefined1 local_3d59 [33];
  Attribute<long_double> *local_3d38;
  allocator local_3cc9;
  string local_3cc8 [39];
  string local_3ca1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3c80 [6];
  allocator local_3c11;
  string local_3c10 [39];
  allocator local_3be9;
  string local_3be8 [40];
  IO *in_stack_ffffffffffffc440;
  Remote *in_stack_ffffffffffffc448;
  string local_3b59;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b31;
  allocator local_3aa1;
  string local_3aa0 [39];
  allocator local_3a79;
  string local_3a78 [32];
  Attribute<unsigned_int> *local_3a58;
  allocator local_39e9;
  string local_39e8 [39];
  allocator local_39c1;
  string local_39c0 [32];
  Attribute<unsigned_short> *local_39a0;
  allocator local_3931;
  string local_3930 [39];
  allocator local_3909;
  string local_3908 [32];
  Attribute<unsigned_char> *local_38e8;
  undefined1 local_3879 [40];
  allocator local_3851;
  string local_3850 [143];
  allocator local_37c1;
  string local_37c0;
  allocator local_3799;
  undefined1 local_3798 [144];
  string local_3708 [39];
  allocator local_36e1;
  string local_36e0 [32];
  Attribute<short> *local_36c0;
  allocator local_3651;
  string local_3650 [39];
  allocator local_3629;
  string local_3628 [143];
  allocator local_3599;
  string local_3598 [39];
  allocator local_3571;
  string local_3570 [32];
  Attribute<char> *local_3550;
  allocator local_34c9;
  string local_34c8 [39];
  allocator local_34a1;
  string local_34a0 [32];
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_3480;
  allocator local_3471;
  string local_3470 [39];
  allocator local_3449;
  string local_3448 [36];
  ArrayOrdering local_3424;
  string local_3420 [32];
  string local_3400 [32];
  string local_33e0 [32];
  string local_33c0 [32];
  reference local_33a0;
  _Self local_3398;
  _Self local_3390;
  undefined1 *local_3388;
  Variable<std::complex<double>_> *local_30d8;
  Variable<std::complex<float>_> *local_2e40;
  Variable<long_double> *local_2b88;
  Variable<double> *local_28f0;
  Variable<float> *local_2660;
  Variable<unsigned_long> *local_23c8;
  Variable<unsigned_int> *local_2138;
  Variable<unsigned_short> *local_1eb0;
  Variable<unsigned_char> *local_1c28;
  Variable<long> *local_1990;
  Variable<int> *local_1700;
  Variable<short> *local_1478;
  Variable<signed_char> *local_11f0;
  Variable<char> *local_f68;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c88;
  DataType local_c7c;
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  reference local_bf8;
  _Self local_bf0;
  _Self local_be8;
  undefined1 *local_be0;
  VarInternalInfo local_bd8;
  allocator local_bb9;
  string local_bb8 [32];
  string local_b98 [32];
  undefined1 local_b78 [48];
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined1 local_b18 [48];
  Engine *local_ae8;
  IO *local_ae0;
  string local_ad8 [40];
  Engine *local_ab0;
  string local_aa8 [32];
  string local_a88 [32];
  string local_a68 [32];
  string local_a48 [32];
  ostream local_a28 [512];
  string local_828 [39];
  allocator local_801;
  string local_800 [32];
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [32];
  string local_798 [39];
  allocator local_771;
  string local_770 [32];
  string local_750 [32];
  string local_730 [32];
  reference local_710;
  CampaignBPFile *local_708;
  __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
  local_700;
  string *local_6f8;
  int local_6ec;
  string local_6e8 [32];
  string local_6c8 [40];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [39];
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [39];
  allocator local_4e9;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [39];
  allocator local_481;
  string local_480 [39];
  undefined1 local_459 [33];
  _Base_ptr local_438;
  undefined1 local_430;
  char *local_428;
  _Base_ptr local_420;
  undefined1 local_418;
  string local_410 [32];
  _Base_ptr local_3f0;
  undefined1 local_3e8;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  _Base_ptr local_360;
  undefined1 local_358;
  _Base_ptr local_350;
  undefined1 local_348;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [32];
  const_reference local_2b0;
  _Self local_2a8;
  _Self local_2a0;
  byte local_291;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  IO *local_230;
  string *local_228;
  reference local_220;
  _Self local_218;
  _Self local_210;
  long local_208;
  int local_1fc;
  reference local_1f0;
  CampaignBPFile *local_1e8;
  __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
  local_1e0;
  string *local_1d8;
  string *local_1d0;
  reference local_1c8;
  _Self local_1c0;
  _Self local_1b8;
  long local_1b0;
  reference local_1a8;
  ulong local_1a0;
  ulong local_198;
  reference local_190;
  ulong local_188;
  string local_180 [32];
  string local_160 [32];
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [36];
  int local_7c;
  string local_78 [32];
  string local_58 [48];
  string local_28 [40];
  
  std::__cxx11::string::string(local_28,(string *)(in_RDI + 0x30));
  bVar1 = adios2sys::SystemTools::FileExists(in_stack_ffffffffffffb958);
  if ((((!bVar1) &&
       (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_28), *pcVar10 != '/')) &&
      (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_28), *pcVar10 != '\\')) &&
     (uVar11 = std::__cxx11::string::empty(), (uVar11 & 1) == 0)) {
    std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38));
    std::operator+(in_stack_ffffffffffffb968,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffb960);
    std::__cxx11::string::~string(local_78);
    bVar1 = adios2sys::SystemTools::FileExists(in_stack_ffffffffffffb958);
    in_stack_ffffffffffffc064 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffc064);
    if (bVar1) {
      std::__cxx11::string::operator=(local_28,local_58);
    }
    std::__cxx11::string::~string(local_58);
  }
  uVar12 = std::__cxx11::string::c_str();
  iVar3 = sqlite3_open(uVar12,in_RDI + 0x1a0);
  local_7c = iVar3;
  if (iVar3 != 0) {
    in_stack_ffffffffffffc058 = (string *)sqlite3_errmsg(*(undefined8 *)(in_RDI + 0x1a0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,(char *)in_stack_ffffffffffffc058,&local_a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    sqlite3_close(*(undefined8 *)(in_RDI + 0x1a0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Engine",&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,"CampaignReader",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"Open",&local_119);
    std::operator+((char *)in_stack_ffffffffffffb9a8,in_stack_ffffffffffffb9a0);
    std::operator+(in_stack_ffffffffffffb968,(char *)in_stack_ffffffffffffb960);
    std::operator+(in_stack_ffffffffffffb968,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffb960);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffb9c0,in_stack_ffffffffffffb9b8,in_stack_ffffffffffffb9b0,
               (string *)in_stack_ffffffffffffb9a8,(int)((ulong)in_stack_ffffffffffffb9a0 >> 0x20));
    std::__cxx11::string::~string(local_140);
    std::__cxx11::string::~string(local_160);
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string(local_a0);
  }
  ReadCampaignData(in_stack_ffffffffffffbfd0,in_stack_ffffffffffffbfc8);
  if (0 < *(int *)(in_RDI + 0xc4)) {
    poVar13 = std::operator<<((ostream *)&std::cout,"Local hostname = ");
    poVar13 = std::operator<<(poVar13,(string *)(in_RDI + 200));
    std::operator<<(poVar13,"\n");
    poVar13 = std::operator<<((ostream *)&std::cout,"Database result:\n  version = ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,*(double *)(in_RDI + 0x1d8));
    std::operator<<(poVar13,"\n  hosts:\n");
    for (local_188 = 0; uVar11 = local_188,
        sVar14 = std::
                 vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                 ::size((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                         *)(in_RDI + 0x1e0)), uVar11 < sVar14; local_188 = local_188 + 1) {
      local_190 = std::
                  vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                *)(in_RDI + 0x1e0),local_188);
      poVar13 = std::operator<<((ostream *)&std::cout,"    host = ");
      poVar13 = std::operator<<(poVar13,(string *)local_190);
      poVar13 = std::operator<<(poVar13,"  long name = ");
      poVar13 = std::operator<<(poVar13,(string *)&local_190->longhostname);
      std::operator<<(poVar13,"  directories: \n");
      for (local_198 = 0; uVar11 = local_198,
          sVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                             (&local_190->dirIdx), uVar11 < sVar14; local_198 = local_198 + 1) {
        poVar13 = std::operator<<((ostream *)&std::cout,"      dir = ");
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(in_RDI + 0x210);
        pvVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (&local_190->dirIdx,local_198);
        pvVar16 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](this_00,*pvVar15);
        poVar13 = std::operator<<(poVar13,(string *)pvVar16);
        std::operator<<(poVar13,"\n");
      }
    }
    std::operator<<((ostream *)&std::cout,"  keys:\n");
    local_1a0 = 0;
    while (uVar11 = local_1a0,
          sVar14 = std::
                   vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                   ::size((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                           *)(in_RDI + 0x1f8)), uVar11 < sVar14) {
      local_1a8 = std::
                  vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                *)(in_RDI + 0x1f8),local_1a0);
      poVar13 = std::operator<<((ostream *)&std::cout,"    key = ");
      poVar13 = std::operator<<(poVar13,(string *)local_1a8);
      std::operator<<(poVar13,"\n");
      local_1a0 = local_1a0 + 1;
    }
    std::operator<<((ostream *)&std::cout,"  datasets:\n");
    local_1b0 = in_RDI + 0x228;
    local_1b8._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
         ::begin((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
                  *)in_stack_ffffffffffffb958);
    local_1c0._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
         ::end((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
                *)in_stack_ffffffffffffb958);
    while (bVar1 = std::operator!=(&local_1b8,&local_1c0), bVar1) {
      local_1c8 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                               *)0xd89366);
      local_1d0 = (string *)&local_1c8->second;
      poVar13 = std::operator<<((ostream *)&std::cout,"    ");
      pvVar19 = std::
                vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                              *)(in_RDI + 0x1e0),*(size_type *)(local_1d0 + 0x40));
      poVar13 = std::operator<<(poVar13,(string *)pvVar19);
      poVar13 = std::operator<<(poVar13,":");
      pvVar16 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)(in_RDI + 0x210),*(size_type *)(local_1d0 + 0x48));
      poVar13 = std::operator<<(poVar13,(string *)pvVar16);
      poVar13 = std::operator<<(poVar13,'/');
      poVar13 = std::operator<<(poVar13,local_1d0 + 0x20);
      std::operator<<(poVar13,"\n");
      poVar13 = std::operator<<((ostream *)&std::cout,"      uuid: ");
      poVar13 = std::operator<<(poVar13,local_1d0);
      std::operator<<(poVar13,"\n");
      local_1d8 = local_1d0 + 0x60;
      local_1e0._M_current =
           (CampaignBPFile *)
           std::
           vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
           ::begin((vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                    *)in_stack_ffffffffffffb958);
      local_1e8 = (CampaignBPFile *)
                  std::
                  vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                  ::end((vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                         *)in_stack_ffffffffffffb958);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                                 *)in_stack_ffffffffffffb960,
                                (__normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                                 *)in_stack_ffffffffffffb958), bVar1) {
        local_1f0 = __gnu_cxx::
                    __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                    ::operator*(&local_1e0);
        poVar13 = std::operator<<((ostream *)&std::cout,"      file: ");
        poVar13 = std::operator<<(poVar13,(string *)local_1f0);
        std::operator<<(poVar13,"\n");
        __gnu_cxx::
        __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
        ::operator++(&local_1e0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>::
      operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                  *)in_stack_ffffffffffffb960);
    }
  }
  std::unique_ptr<adios2::Remote,std::default_delete<adios2::Remote>>::
  unique_ptr<std::default_delete<adios2::Remote>,void>
            ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
             in_stack_ffffffffffffb960,in_stack_ffffffffffffb958);
  local_1fc = -1;
  local_208 = in_RDI + 0x228;
  local_210._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
       ::begin((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
                *)in_stack_ffffffffffffb958);
  local_218._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
       ::end((map<unsigned_long,_adios2::core::engine::CampaignBPDataset,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>_>
              *)in_stack_ffffffffffffb958);
  do {
    bVar1 = std::operator!=(&local_210,&local_218);
    if (!bVar1) {
      std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::~unique_ptr
                ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                 in_stack_ffffffffffffb970);
      std::__cxx11::string::~string(local_28);
      return;
    }
    local_220 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                             *)0xd8964f);
    local_1fc = local_1fc + 1;
    local_228 = (string *)&local_220->second;
    std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffb9a8 >> 0x20));
    std::operator+((char *)in_stack_ffffffffffffb968,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffb960);
    pIVar17 = ADIOS::DeclareIO(in_stack_ffffffffffffbb98,in_stack_ffffffffffffbb90,
                               in_stack_ffffffffffffbb8c);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_270);
    local_230 = pIVar17;
    std::__cxx11::string::string(local_290);
    std::
    vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
    ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffb960,in_stack_ffffffffffffb958);
    if (bVar1) {
      local_291 = 0;
      std::
      vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
      ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
      local_2a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
                   *)in_stack_ffffffffffffb958,(key_type *)0xd897b0);
      local_2a8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
                  *)in_stack_ffffffffffffb958);
      bVar1 = std::operator!=(&local_2a0,&local_2a8);
      if (bVar1) {
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>
        ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>
                      *)0xd8980e);
        local_2b0 = std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::front
                              ((vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> *)
                               in_stack_ffffffffffffb960);
        if (local_2b0->protocol == S3) {
          std::__cxx11::string::string(local_2d0,(string *)&local_2b0->endpoint);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x210),*(size_type *)(local_228 + 0x48));
          std::operator+(in_stack_ffffffffffffb988,(char *)in_stack_ffffffffffffb980);
          std::operator+(in_stack_ffffffffffffb968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffb960);
          std::__cxx11::string::~string(local_310);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)0xd898d0);
          pVar32 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<char_const(&)[8],char_const(&)[7]>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffb970,(char (*) [8])in_stack_ffffffffffffb968,
                              (char (*) [7])in_stack_ffffffffffffb960);
          local_350 = (_Base_ptr)pVar32.first._M_node;
          local_348 = pVar32.second;
          pVar32 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<char_const(&)[9],std::__cxx11::string_const&>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffb970,(char (*) [9])in_stack_ffffffffffffb968,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffb960);
          local_360 = (_Base_ptr)pVar32.first._M_node;
          local_358 = pVar32.second;
          std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38))
          ;
          std::
          vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
          ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                        *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
          std::operator+(in_stack_ffffffffffffb968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffb960);
          std::operator+(in_stack_ffffffffffffb968,(char)((ulong)in_stack_ffffffffffffb960 >> 0x38))
          ;
          std::operator+(in_stack_ffffffffffffb968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffb960);
          pVar32 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<char_const(&)[6],std::__cxx11::string>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffb970,(char (*) [6])in_stack_ffffffffffffb968,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffb960);
          local_3f0 = (_Base_ptr)pVar32.first._M_node;
          local_3e8 = pVar32.second;
          std::__cxx11::string::~string(local_380);
          std::__cxx11::string::~string(local_3a0);
          std::__cxx11::string::~string(local_3c0);
          std::__cxx11::string::~string(local_3e0);
          std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffb9a8 >> 0x20));
          pVar32 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<char_const(&)[8],std::__cxx11::string>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffb970,(char (*) [8])in_stack_ffffffffffffb968,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffb960);
          local_420 = (_Base_ptr)pVar32.first._M_node;
          in_stack_ffffffffffffbf07 = pVar32.second;
          local_418 = in_stack_ffffffffffffbf07;
          std::__cxx11::string::~string(local_410);
          local_428 = "AWS_EC2_METADATA_DISABLED=false";
          if ((local_2b0->recheckMetadata & 1U) != 0) {
            local_428 = "AWS_EC2_METADATA_DISABLED=true";
          }
          local_428 = local_428 + 0x1a;
          pVar32 = std::
                   map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                   ::emplace<char_const(&)[17],char_const*>
                             ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_ffffffffffffb970,(char (*) [17])in_stack_ffffffffffffb968,
                              (char **)in_stack_ffffffffffffb960);
          in_stack_ffffffffffffbef8 = pVar32.first._M_node;
          in_stack_ffffffffffffbef7 = pVar32.second;
          in_stack_ffffffffffffbee8 = (string *)local_459;
          local_438 = in_stack_ffffffffffffbef8._M_node;
          local_430 = in_stack_ffffffffffffbef7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_459 + 1),"File",(allocator *)in_stack_ffffffffffffbee8);
          IO::AddTransport(in_stack_ffffffffffffbb70,(string *)in_stack_ffffffffffffbb68,
                           (Params *)in_stack_ffffffffffffbb60);
          std::__cxx11::string::~string((string *)(local_459 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_459);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_480,"BP5",&local_481);
          IO::SetEngine((IO *)CONCAT44(in_stack_ffffffffffffc064,iVar3),in_stack_ffffffffffffc058);
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 0x210),*(size_type *)(local_228 + 0x48));
          std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38))
          ;
          std::operator+(in_stack_ffffffffffffb968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffb960);
          std::__cxx11::string::operator=(local_290,local_4a8);
          std::__cxx11::string::~string(local_4a8);
          std::__cxx11::string::~string(local_4c8);
          if ((local_2b0->isAWS_EC2 & 1U) == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_510,"AWS_EC2_METADATA_DISABLED=true",&local_511);
            adios2sys::SystemTools::PutEnv(in_stack_ffffffffffffb988);
            std::__cxx11::string::~string(local_510);
            std::allocator<char>::~allocator((allocator<char> *)&local_511);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_4e8,"AWS_EC2_METADATA_DISABLED=false",&local_4e9);
            adios2sys::SystemTools::PutEnv(in_stack_ffffffffffffb988);
            std::__cxx11::string::~string(local_4e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
          }
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            std::operator+((char *)in_stack_ffffffffffffb9a8,in_stack_ffffffffffffb9a0);
            adios2sys::SystemTools::PutEnv(in_stack_ffffffffffffb988);
            std::__cxx11::string::~string(local_560);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_538,"AWS_PROFILE=default",&local_539);
            adios2sys::SystemTools::PutEnv(in_stack_ffffffffffffb988);
            std::__cxx11::string::~string(local_538);
            std::allocator<char>::~allocator((allocator<char> *)&local_539);
          }
          local_291 = 1;
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0xd8a1af);
          std::__cxx11::string::~string(local_2f0);
          std::__cxx11::string::~string(local_2d0);
        }
      }
      if ((local_291 & 1) != 0) goto LAB_00d8b271;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x210),*(size_type *)(local_228 + 0x48));
      std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38));
      std::operator+(in_stack_ffffffffffffb968,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffb960);
      std::__cxx11::string::~string(local_5a0);
      std::
      vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
      ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
      std::operator+(in_stack_ffffffffffffb988,(char *)in_stack_ffffffffffffb980);
      std::operator+(in_stack_ffffffffffffb968,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffb960);
      std::__cxx11::string::~string(local_5e0);
      std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38));
      std::__cxx11::string::substr((ulong)local_680,(ulong)local_228);
      std::operator+(in_stack_ffffffffffffb998,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffb994,in_stack_ffffffffffffb990));
      std::operator+(in_stack_ffffffffffffb968,(char)((ulong)in_stack_ffffffffffffb960 >> 0x38));
      std::operator+(in_stack_ffffffffffffb968,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffb960);
      std::__cxx11::string::operator=(local_290,local_600);
      std::__cxx11::string::~string(local_600);
      std::__cxx11::string::~string(local_620);
      std::__cxx11::string::~string(local_640);
      std::__cxx11::string::~string(local_680);
      std::__cxx11::string::~string(local_660);
      if (0 < *(int *)(in_RDI + 0xc4)) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Open remote file ");
        poVar13 = std::operator<<(poVar13,local_5c0);
        poVar13 = std::operator<<(poVar13,"\n    and use local cache for metadata at ");
        poVar13 = std::operator<<(poVar13,local_290);
        std::operator<<(poVar13," \n");
      }
      helper::CreateDirectory((string *)in_stack_ffffffffffffb970);
      std::__cxx11::string::string(local_6a0);
      if (((byte)local_228[0x50] & 1) == 0) {
LAB_00d8a9f4:
        local_6f8 = local_228 + 0x60;
        local_700._M_current =
             (CampaignBPFile *)
             std::
             vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
             ::begin((vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                      *)in_stack_ffffffffffffb958);
        local_708 = (CampaignBPFile *)
                    std::
                    vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                    ::end((vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>
                           *)in_stack_ffffffffffffb958);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                                   *)in_stack_ffffffffffffb960,
                                  (__normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                                   *)in_stack_ffffffffffffb958), bVar1) {
          local_710 = __gnu_cxx::
                      __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
                      ::operator*(&local_700);
          std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38))
          ;
          std::operator+(in_stack_ffffffffffffb968,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffb960);
          SaveToFile((sqlite3 *)CONCAT17(in_stack_ffffffffffffbf07,in_stack_ffffffffffffbf00),
                     (string *)in_stack_ffffffffffffbef8._M_node,
                     (CampaignBPFile *)CONCAT17(in_stack_ffffffffffffbef7,in_stack_ffffffffffffbef0)
                     ,in_stack_ffffffffffffbee8);
          std::__cxx11::string::~string(local_730);
          std::__cxx11::string::~string(local_750);
          __gnu_cxx::
          __normal_iterator<adios2::core::engine::CampaignBPFile_*,_std::vector<adios2::core::engine::CampaignBPFile,_std::allocator<adios2::core::engine::CampaignBPFile>_>_>
          ::operator++(&local_700);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_770,"RemoteDataPath",&local_771);
        std::__cxx11::string::string(local_798,local_580);
        IO::SetParameter((IO *)CONCAT44(in_stack_ffffffffffffb994,in_stack_ffffffffffffb990),
                         in_stack_ffffffffffffb988,(string *)in_stack_ffffffffffffb980);
        std::__cxx11::string::~string(local_798);
        std::__cxx11::string::~string(local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_7b8,"RemoteHost",&local_7b9);
        pvVar19 = std::
                  vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
        std::__cxx11::string::string(local_7e0,(string *)pvVar19);
        IO::SetParameter((IO *)CONCAT44(in_stack_ffffffffffffb994,in_stack_ffffffffffffb990),
                         in_stack_ffffffffffffb988,(string *)in_stack_ffffffffffffb980);
        std::__cxx11::string::~string(local_7e0);
        std::__cxx11::string::~string(local_7b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_800,"UUID",&local_801);
        std::__cxx11::string::string(local_828,local_228);
        IO::SetParameter((IO *)CONCAT44(in_stack_ffffffffffffb994,in_stack_ffffffffffffb990),
                         in_stack_ffffffffffffb988,(string *)in_stack_ffffffffffffb980);
        std::__cxx11::string::~string(local_828);
        std::__cxx11::string::~string(local_800);
        std::allocator<char>::~allocator((allocator<char> *)&local_801);
        std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38));
        std::operator+(in_stack_ffffffffffffb968,(char *)in_stack_ffffffffffffb960);
        std::ofstream::ofstream(local_a28,local_a48,_S_out);
        std::__cxx11::string::~string(local_a48);
        std::__cxx11::string::~string(local_a68);
        bVar2 = std::ofstream::is_open();
        if ((bVar2 & 1) != 0) {
          poVar13 = std::operator<<(local_a28,"Campaign = ");
          poVar13 = std::operator<<(poVar13,(string *)(in_RDI + 0x30));
          std::operator<<(poVar13,"\n");
          poVar13 = std::operator<<(local_a28,"Dataset = ");
          in_stack_ffffffffffffbd98 = (IO *)std::operator<<(poVar13,local_228 + 0x20);
          std::operator<<((ostream *)in_stack_ffffffffffffbd98,"\n");
          in_stack_ffffffffffffbd90 = std::operator<<(local_a28,"RemoteHost = ");
          pvVar19 = std::
                    vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    ::operator[]((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                  *)(in_RDI + 0x1e0),*(size_type *)(local_228 + 0x40));
          poVar13 = std::operator<<(in_stack_ffffffffffffbd90,(string *)pvVar19);
          std::operator<<(poVar13,"\n");
          poVar13 = std::operator<<(local_a28,"RemoteDataPath = ");
          poVar13 = std::operator<<(poVar13,local_580);
          std::operator<<(poVar13,"\n");
          std::ofstream::close();
        }
        std::ofstream::~ofstream(local_a28);
        local_6ec = 0;
      }
      else {
        if (0 < *(int *)(in_RDI + 0xc4)) {
          poVar13 = std::operator<<((ostream *)&std::cout,
                                    "The dataset is key protected with key id ");
          pvVar18 = std::
                    vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                  *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
          poVar13 = std::operator<<(poVar13,(string *)pvVar18);
          std::operator<<(poVar13,"\n");
        }
        std::
        vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
        ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) != 0) {
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                             0xd8a68b);
          if (!bVar1) {
            operator_new(0x20);
            ADIOS::StaticGetHostOptions_abi_cxx11_();
            Remote::Remote((Remote *)in_stack_ffffffffffffb960,
                           (HostOptions *)in_stack_ffffffffffffb958);
            std::unique_ptr<adios2::Remote,std::default_delete<adios2::Remote>>::
            unique_ptr<std::default_delete<adios2::Remote>,void>
                      ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                       in_stack_ffffffffffffb960,(pointer)in_stack_ffffffffffffb958);
            std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator=
                      ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                       in_stack_ffffffffffffb960,
                       (unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                       in_stack_ffffffffffffb958);
            std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::~unique_ptr
                      ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)
                       in_stack_ffffffffffffb970);
          }
          std::unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_>::operator->
                    ((unique_ptr<adios2::Remote,_std::default_delete<adios2::Remote>_> *)0xd8a739);
          pvVar18 = std::
                    vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                  *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
          std::__cxx11::string::string(local_6e8,(string *)pvVar18);
          Remote::GetKeyFromConnectionManager
                    (in_stack_ffffffffffffc448,(string *)in_stack_ffffffffffffc440);
          pvVar18 = std::
                    vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                  *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
          std::__cxx11::string::operator=((string *)&pvVar18->keyHex,local_6c8);
          std::__cxx11::string::~string(local_6c8);
          std::__cxx11::string::~string(local_6e8);
          if (0 < *(int *)(in_RDI + 0xc4)) {
            poVar13 = std::operator<<((ostream *)&std::cout,"-- Received key ");
            pvVar18 = std::
                      vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                    *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
            poVar13 = std::operator<<(poVar13,(string *)&pvVar18->keyHex);
            std::operator<<(poVar13,"\n");
          }
        }
        std::
        vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
        ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffb960,(char *)in_stack_ffffffffffffb958);
        if (!bVar1) {
          pvVar18 = std::
                    vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                    ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                  *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
          std::__cxx11::string::operator=(local_6a0,(string *)&pvVar18->keyHex);
          goto LAB_00d8a9f4;
        }
        poVar13 = std::operator<<((ostream *)&std::cerr,"ERROR: don\'t have the key ");
        pvVar18 = std::
                  vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ::operator[]((vector<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                *)(in_RDI + 0x1f8),*(size_type *)(local_228 + 0x58));
        poVar13 = std::operator<<(poVar13,(string *)pvVar18);
        poVar13 = std::operator<<(poVar13," to decrypt ");
        poVar13 = std::operator<<(poVar13,local_228 + 0x20);
        poVar13 = std::operator<<(poVar13,". Ignoring this dataset.");
        std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
        local_6ec = 0x10;
      }
      std::__cxx11::string::~string(local_6a0);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::string::~string(local_580);
      if (local_6ec == 0) goto LAB_00d8b271;
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x210),*(size_type *)(local_228 + 0x48));
      std::operator+(in_stack_ffffffffffffb978,(char)((ulong)in_stack_ffffffffffffb970 >> 0x38));
      std::operator+(in_stack_ffffffffffffb968,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffb960);
      std::__cxx11::string::operator=(local_290,local_a88);
      std::__cxx11::string::~string(local_a88);
      std::__cxx11::string::~string(local_aa8);
      if (0 < *(int *)(in_RDI + 0xc4)) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Open local file ");
        poVar13 = std::operator<<(poVar13,local_290);
        std::operator<<(poVar13,"\n");
      }
LAB_00d8b271:
      std::__cxx11::string::string(local_ad8);
      helper::Comm::Duplicate((Comm *)in_stack_ffffffffffffb988,(string *)in_stack_ffffffffffffb980)
      ;
      pEVar20 = IO::Open(in_stack_ffffffffffffc240,in_stack_ffffffffffffc238,
                         in_stack_ffffffffffffc234,in_stack_ffffffffffffc228,
                         in_stack_ffffffffffffc220,in_stack_ffffffffffffc218);
      helper::Comm::~Comm((Comm *)0xd8b316);
      std::__cxx11::string::~string(local_ad8);
      local_ae0 = local_230;
      local_ab0 = pEVar20;
      std::vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::push_back
                ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
                 in_stack_ffffffffffffb960,(value_type *)in_stack_ffffffffffffb958);
      local_ae8 = local_ab0;
      std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::push_back
                ((vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *)
                 in_stack_ffffffffffffb960,(value_type *)in_stack_ffffffffffffb958);
      local_b28 = 0;
      uStack_b20 = 0;
      local_b38 = 0;
      uStack_b30 = 0;
      local_b48 = 0;
      uStack_b40 = 0;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0xd8b3cf);
      IO::GetAvailableVariables
                (in_stack_ffffffffffffbd98,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffbd90);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0xd8b3f9);
      std::__cxx11::string::string(local_b98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bb8,"/",&local_bb9);
      IO::GetAvailableAttributes
                (in_stack_ffffffffffffba88,in_stack_ffffffffffffba80,in_stack_ffffffffffffba78,
                 SUB41(in_stack_ffffffffffffba74 >> 0x18,0));
      std::__cxx11::string::~string(local_bb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
      std::__cxx11::string::~string(local_b98);
      sVar14 = std::vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>::size
                         ((vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *)
                          (in_RDI + 0x138));
      sVar21 = std::vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>::size
                         ((vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *
                          )(in_RDI + 0x150));
      VarInternalInfo::VarInternalInfo(&local_bd8,(void *)0x0,sVar14 - 1,sVar21 - 1);
      local_be0 = local_b18;
      local_be8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffb958);
      local_bf0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffb958);
      while (bVar1 = std::operator!=(&local_be8,&local_bf0), bVar1) {
        local_bf8 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                 *)0xd8b56e);
        std::__cxx11::string::string(local_c18,(string *)local_bf8);
        std::__cxx11::string::string(local_c38,local_228 + 0x20);
        std::operator+(in_stack_ffffffffffffb988,(char *)in_stack_ffffffffffffb980);
        std::operator+(in_stack_ffffffffffffb968,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffb960);
        std::__cxx11::string::~string(local_c78);
        DVar4 = IO::InquireVariableType
                          ((IO *)CONCAT44(in_stack_ffffffffffffb994,in_stack_ffffffffffffb990),
                           in_stack_ffffffffffffb988);
        local_c7c = DVar4;
        if (DVar4 != Struct) {
          DVar5 = helper::GetDataType<std::__cxx11::string>();
          DVar6 = local_c7c;
          if (DVar4 == DVar5) {
            local_c88 = IO::InquireVariable<std::__cxx11::string>
                                  ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                  in_stack_ffffffffffffb9c8),
                                   in_stack_ffffffffffffb9c0);
            DuplicateVariable<std::__cxx11::string>
                      (in_stack_ffffffffffffba48,in_stack_ffffffffffffba40,
                       (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38),
                       in_stack_ffffffffffffba30,(VarInternalInfo *)in_stack_ffffffffffffba28);
            Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Variable(in_stack_ffffffffffffb960);
          }
          else {
            DVar5 = helper::GetDataType<char>();
            DVar4 = local_c7c;
            if (DVar6 == DVar5) {
              local_f68 = IO::InquireVariable<char>
                                    ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                    in_stack_ffffffffffffb9c8),
                                     in_stack_ffffffffffffb9c0);
              DuplicateVariable<char>
                        (in_stack_ffffffffffffba48,(Variable<char> *)in_stack_ffffffffffffba40,
                         (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38),
                         in_stack_ffffffffffffba30,(VarInternalInfo *)in_stack_ffffffffffffba28);
              Variable<char>::~Variable((Variable<char> *)in_stack_ffffffffffffb960);
            }
            else {
              DVar5 = helper::GetDataType<signed_char>();
              DVar6 = local_c7c;
              if (DVar4 == DVar5) {
                local_11f0 = IO::InquireVariable<signed_char>
                                       ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                       in_stack_ffffffffffffb9c8),
                                        in_stack_ffffffffffffb9c0);
                DuplicateVariable<signed_char>
                          (in_stack_ffffffffffffba48,
                           (Variable<signed_char> *)in_stack_ffffffffffffba40,
                           (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38),
                           in_stack_ffffffffffffba30,(VarInternalInfo *)in_stack_ffffffffffffba28);
                Variable<signed_char>::~Variable((Variable<signed_char> *)in_stack_ffffffffffffb960)
                ;
              }
              else {
                DVar5 = helper::GetDataType<short>();
                DVar4 = local_c7c;
                if (DVar6 == DVar5) {
                  local_1478 = IO::InquireVariable<short>
                                         ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                         in_stack_ffffffffffffb9c8),
                                          in_stack_ffffffffffffb9c0);
                  DuplicateVariable<short>
                            (in_stack_ffffffffffffba48,(Variable<short> *)in_stack_ffffffffffffba40,
                             (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38),
                             in_stack_ffffffffffffba30,(VarInternalInfo *)in_stack_ffffffffffffba28)
                  ;
                  Variable<short>::~Variable((Variable<short> *)in_stack_ffffffffffffb960);
                }
                else {
                  DVar5 = helper::GetDataType<int>();
                  DVar6 = local_c7c;
                  if (DVar4 == DVar5) {
                    local_1700 = IO::InquireVariable<int>
                                           ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                           in_stack_ffffffffffffb9c8),
                                            in_stack_ffffffffffffb9c0);
                    DuplicateVariable<int>
                              (in_stack_ffffffffffffba48,(Variable<int> *)in_stack_ffffffffffffba40,
                               (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38),
                               in_stack_ffffffffffffba30,
                               (VarInternalInfo *)in_stack_ffffffffffffba28);
                    Variable<int>::~Variable((Variable<int> *)in_stack_ffffffffffffb960);
                  }
                  else {
                    DVar5 = helper::GetDataType<long>();
                    DVar4 = local_c7c;
                    if (DVar6 == DVar5) {
                      local_1990 = IO::InquireVariable<long>
                                             ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                             in_stack_ffffffffffffb9c8),
                                              in_stack_ffffffffffffb9c0);
                      DuplicateVariable<long>
                                (in_stack_ffffffffffffba48,
                                 (Variable<long> *)in_stack_ffffffffffffba40,
                                 (IO *)CONCAT44(in_stack_ffffffffffffba3c,in_stack_ffffffffffffba38)
                                 ,in_stack_ffffffffffffba30,
                                 (VarInternalInfo *)in_stack_ffffffffffffba28);
                      Variable<long>::~Variable((Variable<long> *)in_stack_ffffffffffffb960);
                    }
                    else {
                      DVar5 = helper::GetDataType<unsigned_char>();
                      DVar6 = local_c7c;
                      if (DVar4 == DVar5) {
                        local_1c28 = IO::InquireVariable<unsigned_char>
                                               ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                               in_stack_ffffffffffffb9c8),
                                                in_stack_ffffffffffffb9c0);
                        DuplicateVariable<unsigned_char>
                                  (in_stack_ffffffffffffba48,
                                   (Variable<unsigned_char> *)in_stack_ffffffffffffba40,
                                   (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                  in_stack_ffffffffffffba38),
                                   in_stack_ffffffffffffba30,
                                   (VarInternalInfo *)in_stack_ffffffffffffba28);
                        Variable<unsigned_char>::~Variable
                                  ((Variable<unsigned_char> *)in_stack_ffffffffffffb960);
                      }
                      else {
                        DVar5 = helper::GetDataType<unsigned_short>();
                        DVar4 = local_c7c;
                        if (DVar6 == DVar5) {
                          local_1eb0 = IO::InquireVariable<unsigned_short>
                                                 ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                                 in_stack_ffffffffffffb9c8),
                                                  in_stack_ffffffffffffb9c0);
                          DuplicateVariable<unsigned_short>
                                    (in_stack_ffffffffffffba48,
                                     (Variable<unsigned_short> *)in_stack_ffffffffffffba40,
                                     (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                    in_stack_ffffffffffffba38),
                                     in_stack_ffffffffffffba30,
                                     (VarInternalInfo *)in_stack_ffffffffffffba28);
                          Variable<unsigned_short>::~Variable
                                    ((Variable<unsigned_short> *)in_stack_ffffffffffffb960);
                        }
                        else {
                          DVar5 = helper::GetDataType<unsigned_int>();
                          DVar6 = local_c7c;
                          if (DVar4 == DVar5) {
                            local_2138 = IO::InquireVariable<unsigned_int>
                                                   ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                                   in_stack_ffffffffffffb9c8),
                                                    in_stack_ffffffffffffb9c0);
                            DuplicateVariable<unsigned_int>
                                      (in_stack_ffffffffffffba48,
                                       (Variable<unsigned_int> *)in_stack_ffffffffffffba40,
                                       (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                      in_stack_ffffffffffffba38),
                                       in_stack_ffffffffffffba30,
                                       (VarInternalInfo *)in_stack_ffffffffffffba28);
                            Variable<unsigned_int>::~Variable
                                      ((Variable<unsigned_int> *)in_stack_ffffffffffffb960);
                          }
                          else {
                            DVar5 = helper::GetDataType<unsigned_long>();
                            DVar4 = local_c7c;
                            if (DVar6 == DVar5) {
                              local_23c8 = IO::InquireVariable<unsigned_long>
                                                     ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                                     in_stack_ffffffffffffb9c8),
                                                      in_stack_ffffffffffffb9c0);
                              DuplicateVariable<unsigned_long>
                                        (in_stack_ffffffffffffba48,
                                         (Variable<unsigned_long> *)in_stack_ffffffffffffba40,
                                         (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                        in_stack_ffffffffffffba38),
                                         in_stack_ffffffffffffba30,
                                         (VarInternalInfo *)in_stack_ffffffffffffba28);
                              Variable<unsigned_long>::~Variable
                                        ((Variable<unsigned_long> *)in_stack_ffffffffffffb960);
                            }
                            else {
                              DVar5 = helper::GetDataType<float>();
                              DVar6 = local_c7c;
                              if (DVar4 == DVar5) {
                                local_2660 = IO::InquireVariable<float>
                                                       ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                                       in_stack_ffffffffffffb9c8),
                                                        in_stack_ffffffffffffb9c0);
                                DuplicateVariable<float>
                                          (in_stack_ffffffffffffba48,
                                           (Variable<float> *)in_stack_ffffffffffffba40,
                                           (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                          in_stack_ffffffffffffba38),
                                           in_stack_ffffffffffffba30,
                                           (VarInternalInfo *)in_stack_ffffffffffffba28);
                                Variable<float>::~Variable
                                          ((Variable<float> *)in_stack_ffffffffffffb960);
                              }
                              else {
                                DVar5 = helper::GetDataType<double>();
                                DVar4 = local_c7c;
                                if (DVar6 == DVar5) {
                                  local_28f0 = IO::InquireVariable<double>
                                                         ((IO *)CONCAT44(in_stack_ffffffffffffb9cc,
                                                                         in_stack_ffffffffffffb9c8),
                                                          in_stack_ffffffffffffb9c0);
                                  DuplicateVariable<double>
                                            (in_stack_ffffffffffffba48,
                                             (Variable<double> *)in_stack_ffffffffffffba40,
                                             (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                            in_stack_ffffffffffffba38),
                                             in_stack_ffffffffffffba30,
                                             (VarInternalInfo *)in_stack_ffffffffffffba28);
                                  Variable<double>::~Variable
                                            ((Variable<double> *)in_stack_ffffffffffffb960);
                                }
                                else {
                                  DVar5 = helper::GetDataType<long_double>();
                                  DVar6 = local_c7c;
                                  if (DVar4 == DVar5) {
                                    local_2b88 = IO::InquireVariable<long_double>
                                                           ((IO *)CONCAT44(in_stack_ffffffffffffb9cc
                                                                           ,
                                                  in_stack_ffffffffffffb9c8),
                                                  in_stack_ffffffffffffb9c0);
                                    DuplicateVariable<long_double>
                                              (in_stack_ffffffffffffba48,
                                               (Variable<long_double> *)in_stack_ffffffffffffba40,
                                               (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                              in_stack_ffffffffffffba38),
                                               in_stack_ffffffffffffba30,
                                               (VarInternalInfo *)in_stack_ffffffffffffba28);
                                    Variable<long_double>::~Variable
                                              ((Variable<long_double> *)in_stack_ffffffffffffb960);
                                  }
                                  else {
                                    DVar5 = helper::GetDataType<std::complex<float>>();
                                    DVar4 = local_c7c;
                                    if (DVar6 == DVar5) {
                                      local_2e40 = IO::InquireVariable<std::complex<float>>
                                                             ((IO *)CONCAT44(
                                                  in_stack_ffffffffffffb9cc,
                                                  in_stack_ffffffffffffb9c8),
                                                  in_stack_ffffffffffffb9c0);
                                      DuplicateVariable<std::complex<float>>
                                                (in_stack_ffffffffffffba48,
                                                 (Variable<std::complex<float>_> *)
                                                 in_stack_ffffffffffffba40,
                                                 (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                                in_stack_ffffffffffffba38),
                                                 in_stack_ffffffffffffba30,
                                                 (VarInternalInfo *)in_stack_ffffffffffffba28);
                                      Variable<std::complex<float>_>::~Variable
                                                ((Variable<std::complex<float>_> *)
                                                 in_stack_ffffffffffffb960);
                                    }
                                    else {
                                      DVar6 = helper::GetDataType<std::complex<double>>();
                                      if (DVar4 == DVar6) {
                                        local_30d8 = IO::InquireVariable<std::complex<double>>
                                                               ((IO *)CONCAT44(
                                                  in_stack_ffffffffffffb9cc,
                                                  in_stack_ffffffffffffb9c8),
                                                  in_stack_ffffffffffffb9c0);
                                        DuplicateVariable<std::complex<double>>
                                                  (in_stack_ffffffffffffba48,
                                                   (Variable<std::complex<double>_> *)
                                                   in_stack_ffffffffffffba40,
                                                   (IO *)CONCAT44(in_stack_ffffffffffffba3c,
                                                                  in_stack_ffffffffffffba38),
                                                   in_stack_ffffffffffffba30,
                                                   (VarInternalInfo *)in_stack_ffffffffffffba28);
                                        Variable<std::complex<double>_>::~Variable
                                                  ((Variable<std::complex<double>_> *)
                                                   in_stack_ffffffffffffb960);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::__cxx11::string::~string(local_c58);
        std::__cxx11::string::~string(local_c38);
        std::__cxx11::string::~string(local_c18);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_ffffffffffffb960);
      }
      local_3388 = local_b78;
      local_3390._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                    *)in_stack_ffffffffffffb958);
      local_3398._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)in_stack_ffffffffffffb958);
      while (bVar1 = std::operator!=(&local_3390,&local_3398), bVar1) {
        local_33a0 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                  *)0xd8bfa9);
        std::__cxx11::string::string(local_33c0,(string *)local_33a0);
        std::__cxx11::string::string(local_33e0,local_228 + 0x20);
        std::operator+(in_stack_ffffffffffffb988,(char *)in_stack_ffffffffffffb980);
        std::operator+(in_stack_ffffffffffffb968,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffb960);
        std::__cxx11::string::~string(local_3420);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3448,"",&local_3449);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3470,"/",&local_3471);
        AVar7 = IO::InquireAttributeType
                          (in_stack_ffffffffffffba08,
                           (string *)CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00),
                           in_stack_ffffffffffffb9f8,(string *)in_stack_ffffffffffffb9f0);
        std::__cxx11::string::~string(local_3470);
        std::allocator<char>::~allocator((allocator<char> *)&local_3471);
        std::__cxx11::string::~string(local_3448);
        std::allocator<char>::~allocator((allocator<char> *)&local_3449);
        local_3424 = AVar7;
        if (AVar7 != 0x10) {
          AVar8 = helper::GetDataType<std::__cxx11::string>();
          AVar9 = local_3424;
          if (AVar7 == AVar8) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_34a0,"",&local_34a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_34c8,"/",&local_34c9);
            pAVar22 = IO::InquireAttribute<std::__cxx11::string>
                                (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                 (string *)in_stack_ffffffffffffba08,
                                 (string *)
                                 CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00));
            std::__cxx11::string::~string(local_34c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_34c9);
            std::__cxx11::string::~string(local_34a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_34a1);
            local_3480 = pAVar22;
            DuplicateAttribute<std::__cxx11::string>
                      ((CampaignReader *)
                       CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                       in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98,in_stack_ffffffffffffba90
                      );
            Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~Attribute((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_ffffffffffffb960);
          }
          else {
            AVar8 = helper::GetDataType<char>();
            AVar7 = local_3424;
            if (AVar9 == AVar8) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3570,"",&local_3571);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_3598,"/",&local_3599);
              pAVar23 = IO::InquireAttribute<char>
                                  (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                   (string *)in_stack_ffffffffffffba08,
                                   (string *)
                                   CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00));
              std::__cxx11::string::~string(local_3598);
              std::allocator<char>::~allocator((allocator<char> *)&local_3599);
              std::__cxx11::string::~string(local_3570);
              std::allocator<char>::~allocator((allocator<char> *)&local_3571);
              local_3550 = pAVar23;
              DuplicateAttribute<char>
                        ((CampaignReader *)
                         CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                         (Attribute<char> *)in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98,
                         in_stack_ffffffffffffba90);
              Attribute<char>::~Attribute((Attribute<char> *)in_stack_ffffffffffffb960);
            }
            else {
              AVar8 = helper::GetDataType<signed_char>();
              AVar9 = local_3424;
              if (AVar7 == AVar8) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3628,"",&local_3629);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3650,"/",&local_3651);
                pAVar24 = IO::InquireAttribute<signed_char>
                                    (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                     (string *)in_stack_ffffffffffffba08,
                                     (string *)
                                     CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00));
                std::__cxx11::string::~string(local_3650);
                std::allocator<char>::~allocator((allocator<char> *)&local_3651);
                std::__cxx11::string::~string(local_3628);
                std::allocator<char>::~allocator((allocator<char> *)&local_3629);
                local_3628._32_8_ = pAVar24;
                DuplicateAttribute<signed_char>
                          ((CampaignReader *)
                           CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                           (Attribute<signed_char> *)in_stack_ffffffffffffbaa0,
                           in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                Attribute<signed_char>::~Attribute
                          ((Attribute<signed_char> *)in_stack_ffffffffffffb960);
              }
              else {
                AVar8 = helper::GetDataType<short>();
                AVar7 = local_3424;
                if (AVar9 == AVar8) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_36e0,"",&local_36e1);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_3708,"/",(allocator *)(local_3798 + 0x8f));
                  pAVar25 = IO::InquireAttribute<short>
                                      (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                       (string *)in_stack_ffffffffffffba08,
                                       (string *)
                                       CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00)
                                      );
                  std::__cxx11::string::~string(local_3708);
                  std::allocator<char>::~allocator((allocator<char> *)(local_3798 + 0x8f));
                  std::__cxx11::string::~string(local_36e0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_36e1);
                  local_36c0 = pAVar25;
                  DuplicateAttribute<short>
                            ((CampaignReader *)
                             CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                             (Attribute<short> *)in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98
                             ,in_stack_ffffffffffffba90);
                  Attribute<short>::~Attribute((Attribute<short> *)in_stack_ffffffffffffb960);
                }
                else {
                  AVar9 = helper::GetDataType<int>();
                  if (AVar7 == AVar9) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)local_3798,"",&local_3799);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_37c0,"/",&local_37c1);
                    in_stack_ffffffffffffbb98 = (ADIOS *)local_3798;
                    in_stack_ffffffffffffbb90 = &local_37c0;
                    pAVar26 = IO::InquireAttribute<int>
                                        (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                         (string *)in_stack_ffffffffffffba08,
                                         (string *)
                                         CONCAT44(in_stack_ffffffffffffba04,
                                                  in_stack_ffffffffffffba00));
                    std::__cxx11::string::~string((string *)in_stack_ffffffffffffbb90);
                    std::allocator<char>::~allocator((allocator<char> *)&local_37c1);
                    std::__cxx11::string::~string((string *)in_stack_ffffffffffffbb98);
                    std::allocator<char>::~allocator((allocator<char> *)&local_3799);
                    local_3798._32_8_ = pAVar26;
                    DuplicateAttribute<int>
                              ((CampaignReader *)
                               CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                               (Attribute<int> *)in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98
                               ,in_stack_ffffffffffffba90);
                    Attribute<int>::~Attribute((Attribute<int> *)in_stack_ffffffffffffb960);
                  }
                  else {
                    in_stack_ffffffffffffbb8c = local_3424;
                    AVar9 = helper::GetDataType<long>();
                    AVar7 = local_3424;
                    if (in_stack_ffffffffffffbb8c == AVar9) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string(local_3850,"",&local_3851);
                      in_stack_ffffffffffffbb70 = (IO *)local_3879;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)(local_3879 + 1),"/",
                                 (allocator *)in_stack_ffffffffffffbb70);
                      in_stack_ffffffffffffbb60 = local_3850;
                      in_stack_ffffffffffffbb68 =
                           IO::InquireAttribute<long>
                                     (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                      (string *)in_stack_ffffffffffffba08,
                                      (string *)
                                      CONCAT44(in_stack_ffffffffffffba04,in_stack_ffffffffffffba00))
                      ;
                      std::__cxx11::string::~string((string *)(local_3879 + 1));
                      std::allocator<char>::~allocator((allocator<char> *)local_3879);
                      std::__cxx11::string::~string(in_stack_ffffffffffffbb60);
                      std::allocator<char>::~allocator((allocator<char> *)&local_3851);
                      local_3850._32_8_ = in_stack_ffffffffffffbb68;
                      DuplicateAttribute<long>
                                ((CampaignReader *)
                                 CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                 (Attribute<long> *)in_stack_ffffffffffffbaa0,
                                 in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                      Attribute<long>::~Attribute((Attribute<long> *)in_stack_ffffffffffffb960);
                    }
                    else {
                      AVar8 = helper::GetDataType<unsigned_char>();
                      AVar9 = local_3424;
                      if (AVar7 == AVar8) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3908,"",&local_3909);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string(local_3930,"/",&local_3931);
                        pAVar27 = IO::InquireAttribute<unsigned_char>
                                            (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                             (string *)in_stack_ffffffffffffba08,
                                             (string *)
                                             CONCAT44(in_stack_ffffffffffffba04,
                                                      in_stack_ffffffffffffba00));
                        std::__cxx11::string::~string(local_3930);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3931);
                        std::__cxx11::string::~string(local_3908);
                        std::allocator<char>::~allocator((allocator<char> *)&local_3909);
                        local_38e8 = pAVar27;
                        DuplicateAttribute<unsigned_char>
                                  ((CampaignReader *)
                                   CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                   (Attribute<unsigned_char> *)in_stack_ffffffffffffbaa0,
                                   in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                        Attribute<unsigned_char>::~Attribute
                                  ((Attribute<unsigned_char> *)in_stack_ffffffffffffb960);
                      }
                      else {
                        AVar8 = helper::GetDataType<unsigned_short>();
                        AVar7 = local_3424;
                        if (AVar9 == AVar8) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_39c0,"",&local_39c1);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string(local_39e8,"/",&local_39e9);
                          pAVar28 = IO::InquireAttribute<unsigned_short>
                                              (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10,
                                               (string *)in_stack_ffffffffffffba08,
                                               (string *)
                                               CONCAT44(in_stack_ffffffffffffba04,
                                                        in_stack_ffffffffffffba00));
                          std::__cxx11::string::~string(local_39e8);
                          std::allocator<char>::~allocator((allocator<char> *)&local_39e9);
                          std::__cxx11::string::~string(local_39c0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_39c1);
                          local_39a0 = pAVar28;
                          DuplicateAttribute<unsigned_short>
                                    ((CampaignReader *)
                                     CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8),
                                     (Attribute<unsigned_short> *)in_stack_ffffffffffffbaa0,
                                     in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                          Attribute<unsigned_short>::~Attribute
                                    ((Attribute<unsigned_short> *)in_stack_ffffffffffffb960);
                        }
                        else {
                          AVar9 = helper::GetDataType<unsigned_int>();
                          if (AVar7 == AVar9) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_3a78,"",&local_3a79);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string(local_3aa0,"/",&local_3aa1);
                            pAVar29 = IO::InquireAttribute<unsigned_int>
                                                (in_stack_ffffffffffffba18,in_stack_ffffffffffffba10
                                                 ,(string *)in_stack_ffffffffffffba08,
                                                 (string *)
                                                 CONCAT44(in_stack_ffffffffffffba04,
                                                          in_stack_ffffffffffffba00));
                            std::__cxx11::string::~string(local_3aa0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_3aa1);
                            std::__cxx11::string::~string(local_3a78);
                            std::allocator<char>::~allocator((allocator<char> *)&local_3a79);
                            local_3a58 = pAVar29;
                            DuplicateAttribute<unsigned_int>
                                      ((CampaignReader *)
                                       CONCAT44(in_stack_ffffffffffffbaac,in_stack_ffffffffffffbaa8)
                                       ,(Attribute<unsigned_int> *)in_stack_ffffffffffffbaa0,
                                       in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                            Attribute<unsigned_int>::~Attribute
                                      ((Attribute<unsigned_int> *)in_stack_ffffffffffffb960);
                          }
                          else {
                            in_stack_ffffffffffffbaac = local_3424;
                            AVar7 = helper::GetDataType<unsigned_long>();
                            if (in_stack_ffffffffffffbaac == AVar7) {
                              in_stack_ffffffffffffbaa0 = &local_3b31;
                              in_stack_ffffffffffffba98 = local_230;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)
                                         ((long)&local_3b31.super_AttributeBase._vptr_AttributeBase
                                         + 1),"",(allocator *)in_stack_ffffffffffffbaa0);
                              in_stack_ffffffffffffba90 = &local_3b59;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)&local_3b59.field_0x1,"/",
                                         (allocator *)in_stack_ffffffffffffba90);
                              in_stack_ffffffffffffba80 =
                                   (string *)
                                   ((long)&local_3b31.super_AttributeBase._vptr_AttributeBase + 1);
                              in_stack_ffffffffffffba78 = (string *)&local_3b59.field_0x1;
                              in_stack_ffffffffffffba88 =
                                   (IO *)IO::InquireAttribute<unsigned_long>
                                                   (in_stack_ffffffffffffba18,
                                                    in_stack_ffffffffffffba10,
                                                    (string *)in_stack_ffffffffffffba08,
                                                    (string *)
                                                    CONCAT44(in_stack_ffffffffffffba04,
                                                             in_stack_ffffffffffffba00));
                              std::__cxx11::string::~string((string *)in_stack_ffffffffffffba78);
                              std::allocator<char>::~allocator((allocator<char> *)&local_3b59);
                              std::__cxx11::string::~string((string *)in_stack_ffffffffffffba80);
                              std::allocator<char>::~allocator((allocator<char> *)&local_3b31);
                              local_3b31.super_AttributeBase._33_8_ = in_stack_ffffffffffffba88;
                              DuplicateAttribute<unsigned_long>
                                        ((CampaignReader *)
                                         CONCAT44(in_stack_ffffffffffffbaac,
                                                  in_stack_ffffffffffffbaa8),
                                         (Attribute<unsigned_long> *)in_stack_ffffffffffffbaa0,
                                         in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                              Attribute<unsigned_long>::~Attribute
                                        ((Attribute<unsigned_long> *)in_stack_ffffffffffffb960);
                            }
                            else {
                              in_stack_ffffffffffffba74 = local_3424;
                              AVar7 = helper::GetDataType<float>();
                              if (in_stack_ffffffffffffba74 == AVar7) {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_3be8,"",&local_3be9);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string(local_3c10,"/",&local_3c11);
                                in_stack_ffffffffffffba48 = (CampaignReader *)local_3be8;
                                in_stack_ffffffffffffba40 =
                                     (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_3c10;
                                pAVar30 = IO::InquireAttribute<float>
                                                    (in_stack_ffffffffffffba18,
                                                     in_stack_ffffffffffffba10,
                                                     (string *)in_stack_ffffffffffffba08,
                                                     (string *)
                                                     CONCAT44(in_stack_ffffffffffffba04,
                                                              in_stack_ffffffffffffba00));
                                std::__cxx11::string::~string((string *)in_stack_ffffffffffffba40);
                                std::allocator<char>::~allocator((allocator<char> *)&local_3c11);
                                std::__cxx11::string::~string((string *)in_stack_ffffffffffffba48);
                                std::allocator<char>::~allocator((allocator<char> *)&local_3be9);
                                local_3be8._32_8_ = pAVar30;
                                DuplicateAttribute<float>
                                          ((CampaignReader *)
                                           CONCAT44(in_stack_ffffffffffffbaac,
                                                    in_stack_ffffffffffffbaa8),
                                           (Attribute<float> *)in_stack_ffffffffffffbaa0,
                                           in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                                Attribute<float>::~Attribute
                                          ((Attribute<float> *)in_stack_ffffffffffffb960);
                              }
                              else {
                                in_stack_ffffffffffffba3c = local_3424;
                                AVar7 = helper::GetDataType<double>();
                                if (in_stack_ffffffffffffba3c == AVar7) {
                                  in_stack_ffffffffffffba30 = &local_3ca1;
                                  in_stack_ffffffffffffba28 = local_230;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            ((string *)&local_3ca1.field_0x1,"",
                                             (allocator *)in_stack_ffffffffffffba30);
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string(local_3cc8,"/",&local_3cc9);
                                  in_stack_ffffffffffffba10 = (string *)&local_3ca1.field_0x1;
                                  in_stack_ffffffffffffba08 = (IO *)local_3cc8;
                                  in_stack_ffffffffffffba18 =
                                       (IO *)IO::InquireAttribute<double>
                                                       (in_stack_ffffffffffffba18,
                                                        in_stack_ffffffffffffba10,
                                                        (string *)in_stack_ffffffffffffba08,
                                                        (string *)
                                                        CONCAT44(in_stack_ffffffffffffba04,
                                                                 in_stack_ffffffffffffba00));
                                  std::__cxx11::string::~string((string *)in_stack_ffffffffffffba08)
                                  ;
                                  std::allocator<char>::~allocator((allocator<char> *)&local_3cc9);
                                  std::__cxx11::string::~string((string *)in_stack_ffffffffffffba10)
                                  ;
                                  std::allocator<char>::~allocator((allocator<char> *)&local_3ca1);
                                  local_3c80[0]._0_8_ = in_stack_ffffffffffffba18;
                                  DuplicateAttribute<double>
                                            ((CampaignReader *)
                                             CONCAT44(in_stack_ffffffffffffbaac,
                                                      in_stack_ffffffffffffbaa8),
                                             (Attribute<double> *)in_stack_ffffffffffffbaa0,
                                             in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                                  Attribute<double>::~Attribute
                                            ((Attribute<double> *)in_stack_ffffffffffffb960);
                                }
                                else {
                                  in_stack_ffffffffffffba04 = local_3424;
                                  AVar7 = helper::GetDataType<long_double>();
                                  if (in_stack_ffffffffffffba04 == AVar7) {
                                    in_stack_ffffffffffffb9f8 = (string *)local_3d59;
                                    in_stack_ffffffffffffb9f0 = local_230;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)(local_3d59 + 1),"",
                                               (allocator *)in_stack_ffffffffffffb9f8);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string(local_3d80,"/",&local_3d81);
                                    pAVar31 = IO::InquireAttribute<long_double>
                                                        (in_stack_ffffffffffffba18,
                                                         in_stack_ffffffffffffba10,
                                                         (string *)in_stack_ffffffffffffba08,
                                                         (string *)
                                                         CONCAT44(in_stack_ffffffffffffba04,
                                                                  in_stack_ffffffffffffba00));
                                    std::__cxx11::string::~string(local_3d80);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_3d81)
                                    ;
                                    std::__cxx11::string::~string((string *)(local_3d59 + 1));
                                    std::allocator<char>::~allocator((allocator<char> *)local_3d59);
                                    local_3d38 = pAVar31;
                                    DuplicateAttribute<long_double>
                                              ((CampaignReader *)
                                               CONCAT44(in_stack_ffffffffffffbaac,
                                                        in_stack_ffffffffffffbaa8),
                                               (Attribute<long_double> *)in_stack_ffffffffffffbaa0,
                                               in_stack_ffffffffffffba98,in_stack_ffffffffffffba90);
                                    Attribute<long_double>::~Attribute
                                              ((Attribute<long_double> *)in_stack_ffffffffffffb960);
                                  }
                                  else {
                                    in_stack_ffffffffffffb9cc = local_3424;
                                    AVar7 = helper::GetDataType<std::complex<float>>();
                                    if (in_stack_ffffffffffffb9cc == AVar7) {
                                      in_stack_ffffffffffffb9c0 = &local_3e21;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_3e21.field_0x1,"",
                                                 (allocator *)in_stack_ffffffffffffb9c0);
                                      paVar33 = &local_3e49;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_3e48,"/",paVar33);
                                      in_stack_ffffffffffffb9a0 =
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&local_3e21.field_0x1;
                                      in_stack_ffffffffffffb998 = &local_3e48;
                                      in_stack_ffffffffffffb9a8 =
                                           IO::InquireAttribute<std::complex<float>>
                                                     (in_stack_ffffffffffffba18,
                                                      in_stack_ffffffffffffba10,
                                                      (string *)in_stack_ffffffffffffba08,
                                                      (string *)
                                                      CONCAT44(in_stack_ffffffffffffba04,
                                                               in_stack_ffffffffffffba00));
                                      std::__cxx11::string::~string
                                                ((string *)in_stack_ffffffffffffb998);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_3e49);
                                      std::__cxx11::string::~string
                                                ((string *)in_stack_ffffffffffffb9a0);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_3e21);
                                      local_3e00 = in_stack_ffffffffffffb9a8;
                                      DuplicateAttribute<std::complex<float>>
                                                ((CampaignReader *)
                                                 CONCAT44(in_stack_ffffffffffffbaac,
                                                          in_stack_ffffffffffffbaa8),
                                                 (Attribute<std::complex<float>_> *)
                                                 in_stack_ffffffffffffbaa0,in_stack_ffffffffffffba98
                                                 ,in_stack_ffffffffffffba90);
                                      Attribute<std::complex<float>_>::~Attribute
                                                ((Attribute<std::complex<float>_> *)
                                                 in_stack_ffffffffffffb960);
                                    }
                                    else {
                                      in_stack_ffffffffffffb994 = local_3424;
                                      AVar7 = helper::GetDataType<std::complex<double>>();
                                      if (in_stack_ffffffffffffb994 == AVar7) {
                                        in_stack_ffffffffffffb988 = &local_3ed9;
                                        in_stack_ffffffffffffb980 = local_230;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_3ed9.field_0x1,"",
                                                   (allocator *)in_stack_ffffffffffffb988);
                                        in_stack_ffffffffffffb978 =
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_3f01;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)(local_3f01 + 1),"/",
                                                   (allocator *)in_stack_ffffffffffffb978);
                                        in_stack_ffffffffffffb968 =
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&local_3ed9.field_0x1;
                                        in_stack_ffffffffffffb960 =
                                             (Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)(local_3f01 + 1);
                                        in_stack_ffffffffffffb970 =
                                             IO::InquireAttribute<std::complex<double>>
                                                       (in_stack_ffffffffffffba18,
                                                        in_stack_ffffffffffffba10,
                                                        (string *)in_stack_ffffffffffffba08,
                                                        (string *)
                                                        CONCAT44(in_stack_ffffffffffffba04,
                                                                 in_stack_ffffffffffffba00));
                                        std::__cxx11::string::~string
                                                  ((string *)in_stack_ffffffffffffb960);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)local_3f01);
                                        std::__cxx11::string::~string
                                                  ((string *)in_stack_ffffffffffffb968);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_3ed9);
                                        local_3eb8 = in_stack_ffffffffffffb970;
                                        DuplicateAttribute<std::complex<double>>
                                                  ((CampaignReader *)
                                                   CONCAT44(in_stack_ffffffffffffbaac,
                                                            in_stack_ffffffffffffbaa8),
                                                   (Attribute<std::complex<double>_> *)
                                                   in_stack_ffffffffffffbaa0,
                                                   in_stack_ffffffffffffba98,
                                                   in_stack_ffffffffffffba90);
                                        Attribute<std::complex<double>_>::~Attribute
                                                  ((Attribute<std::complex<double>_> *)
                                                   in_stack_ffffffffffffb960);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::__cxx11::string::~string(local_3400);
        std::__cxx11::string::~string(local_33e0);
        std::__cxx11::string::~string(local_33c0);
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)in_stack_ffffffffffffb960);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0xd8db4a);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)0xd8db57);
      local_6ec = 0;
    }
    std::__cxx11::string::~string(local_290);
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_adios2::core::engine::CampaignBPDataset>_>
                  *)in_stack_ffffffffffffb960);
  } while( true );
}

Assistant:

void CampaignReader::InitTransports()
{
    std::string path = m_Name;
    if (!adios2sys::SystemTools::FileExists(path) && path[0] != '/' && path[0] != '\\' &&
        !m_Options.campaignstorepath.empty())
    {
        std::string path2 = m_Options.campaignstorepath + PathSeparator + m_Name;
        if (adios2sys::SystemTools::FileExists(path2))
        {
            path = path2;
        }
    }

    int rc = sqlite3_open(path.c_str(), &m_DB);
    if (rc)
    {
        std::string dbmsg(sqlite3_errmsg(m_DB));
        sqlite3_close(m_DB);
        helper::Throw<std::invalid_argument>("Engine", "CampaignReader", "Open",
                                             "Cannot open database" + path + ": " + dbmsg);
    }

    ReadCampaignData(m_DB, m_CampaignData);

    if (m_Options.verbose > 0)
    {
        std::cout << "Local hostname = " << m_Options.hostname << "\n";
        std::cout << "Database result:\n  version = " << m_CampaignData.version.version
                  << "\n  hosts:\n";

        for (size_t hostidx = 0; hostidx < m_CampaignData.hosts.size(); ++hostidx)
        {
            CampaignHost &h = m_CampaignData.hosts[hostidx];
            std::cout << "    host = " << h.hostname << "  long name = " << h.longhostname
                      << "  directories: \n";
            for (size_t diridx = 0; diridx < h.dirIdx.size(); ++diridx)
            {
                std::cout << "      dir = " << m_CampaignData.directory[h.dirIdx[diridx]] << "\n";
            }
        }
        std::cout << "  keys:\n";
        for (size_t keyidx = 0; keyidx < m_CampaignData.keys.size(); ++keyidx)
        {
            CampaignKey &k = m_CampaignData.keys[keyidx];
            std::cout << "    key = " << k.id << "\n";
        }
        std::cout << "  datasets:\n";
        for (auto &it : m_CampaignData.bpdatasets)
        {
            CampaignBPDataset &ds = it.second;
            std::cout << "    " << m_CampaignData.hosts[ds.hostIdx].hostname << ":"
                      << m_CampaignData.directory[ds.dirIdx] << PathSeparator << ds.name << "\n";
            std::cout << "      uuid: " << ds.uuid << "\n";
            for (auto &bpf : ds.files)
            {
                std::cout << "      file: " << bpf.name << "\n";
            }
        }
    }

    // std::string cs = m_Comm.BroadcastFile(m_Name, "broadcast campaign file");
    // nlohmann::json js = nlohmann::json::parse(cs);
    // std::cout << "JSON rank " << m_ReaderRank << ": " << js.size() <<
    // std::endl;
    std::unique_ptr<Remote> connectionManager = nullptr;
    int i = -1;
    for (auto &it : m_CampaignData.bpdatasets)
    {
        ++i;
        CampaignBPDataset &ds = it.second;
        adios2::core::IO &io = m_IO.m_ADIOS.DeclareIO("CampaignReader" + std::to_string(i));
        std::string localPath;
        if (m_CampaignData.hosts[ds.hostIdx].hostname != m_Options.hostname)
        {
            bool done = false;
            auto it = m_HostOptions.find(m_CampaignData.hosts[ds.hostIdx].hostname);
            if (it != m_HostOptions.end())
            {
                const HostConfig &ho = (it->second).front();
                if (ho.protocol == HostAccessProtocol::S3)
                {
                    const std::string endpointURL = ho.endpoint;
                    const std::string objPath = m_CampaignData.directory[ds.dirIdx] + "/" + ds.name;
                    Params p;
                    p.emplace("Library", "awssdk");
                    p.emplace("endpoint", endpointURL);
                    p.emplace("cache", m_Options.cachepath + PathSeparator +
                                           m_CampaignData.hosts[ds.hostIdx].hostname +
                                           PathSeparator + m_Name);
                    p.emplace("verbose", std::to_string(ho.verbose));
                    p.emplace("recheck_metadata", (ho.recheckMetadata ? "true" : "false"));
                    io.AddTransport("File", p);
                    io.SetEngine("BP5");
                    localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                    if (ho.isAWS_EC2)
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=false");
                    }
                    else
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=true");
                    }

                    if (ho.awsProfile.empty())
                    {
                        adios2sys::SystemTools::PutEnv("AWS_PROFILE=default");
                    }
                    else
                    {
                        std::string es = "AWS_PROFILE=" + ho.awsProfile;
                        adios2sys::SystemTools::PutEnv(es);
                    }

                    done = true;
                }
            }

            if (!done)
            {
                const std::string remotePath =
                    m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                const std::string remoteURL =
                    m_CampaignData.hosts[ds.hostIdx].hostname + ":" + remotePath;
                localPath = m_Options.cachepath + PathSeparator + ds.uuid.substr(0, 3) +
                            PathSeparator + ds.uuid;
                if (m_Options.verbose > 0)
                {
                    std::cout << "Open remote file " << remoteURL
                              << "\n    and use local cache for metadata at " << localPath << " \n";
                }
                helper::CreateDirectory(localPath);

                std::string keyhex;
                if (ds.hasKey)
                {
                    if (m_Options.verbose > 0)
                    {
                        std::cout << "The dataset is key protected with key id "
                                  << m_CampaignData.keys[ds.keyIdx].id << "\n";
                    }
#ifdef ADIOS2_HAVE_SODIUM
                    if (m_CampaignData.keys[ds.keyIdx].keyHex.empty())
                    {
                        // Retrieve key
                        if (!connectionManager)
                        {
                            connectionManager = std::unique_ptr<Remote>(
                                new Remote(core::ADIOS::StaticGetHostOptions()));
                        }
                        m_CampaignData.keys[ds.keyIdx].keyHex =
                            connectionManager->GetKeyFromConnectionManager(
                                m_CampaignData.keys[ds.keyIdx].id);

                        if (m_Options.verbose > 0)
                        {
                            std::cout << "-- Received key " << m_CampaignData.keys[ds.keyIdx].keyHex
                                      << "\n";
                        }
                    }

                    if (m_CampaignData.keys[ds.keyIdx].keyHex == "0")
                    {
                        // We received no key, ignore files encrypted with this key
                        std::cerr << "ERROR: don't have the key "
                                  << m_CampaignData.keys[ds.keyIdx].id << " to decrypt " << ds.name
                                  << ". Ignoring this dataset." << std::endl;
                        continue;
                    }

                    keyhex = m_CampaignData.keys[ds.keyIdx].keyHex;
#else
                    helper::Throw<std::runtime_error>(
                        "Engine", "CampaignReader", "InitTransports",
                        "ADIOS needs to be built with libsodium and with SST to "
                        "be able to process protected campaign files");
#endif
                }

                for (auto &bpf : ds.files)
                {
                    SaveToFile(m_DB, localPath + PathSeparator + bpf.name, bpf, keyhex);
                }
                io.SetParameter("RemoteDataPath", remotePath);
                io.SetParameter("RemoteHost", m_CampaignData.hosts[ds.hostIdx].hostname);
                io.SetParameter("UUID", ds.uuid);

                // Save info in cache directory for cache manager and for humans
                {
                    std::ofstream f(localPath + PathSeparator + "info.txt");
                    if (f.is_open())
                    {
                        f << "Campaign = " << m_Name << "\n";
                        f << "Dataset = " << ds.name << "\n";
                        f << "RemoteHost = " << m_CampaignData.hosts[ds.hostIdx].hostname << "\n";
                        f << "RemoteDataPath = " << remotePath << "\n";
                        f.close();
                    }
                }
            }
        }
        else
        {
            localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
            if (m_Options.verbose > 0)
            {
                std::cout << "Open local file " << localPath << "\n";
            }
        }

        adios2::core::Engine &e = io.Open(localPath, m_OpenMode, m_Comm.Duplicate());

        m_IOs.push_back(&io);
        m_Engines.push_back(&e);

        auto vmap = io.GetAvailableVariables();
        auto amap = io.GetAvailableAttributes();
        VarInternalInfo internalInfo(nullptr, m_IOs.size() - 1, m_Engines.size() - 1);

        for (auto &vr : vmap)
        {
            auto vname = vr.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + vname;

            const DataType type = io.InquireVariableType(vname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *vi = io.InquireVariable<T>(vname);                                            \
        Variable<T> v = DuplicateVariable(vi, m_IO, newname, internalInfo);                        \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }

        for (auto &ar : amap)
        {
            auto aname = ar.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + aname;

            const DataType type = io.InquireAttributeType(aname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Attribute<T> *ai = io.InquireAttribute<T>(aname);                                          \
        Attribute<T> v = DuplicateAttribute(ai, m_IO, newname);                                    \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }
    }
}